

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O0

int N_VWrmsNormVectorArray(int nvec,N_Vector *X,N_Vector *W,realtype *nrm)

{
  realtype rVar1;
  int local_2c;
  int ier;
  int i;
  realtype *nrm_local;
  N_Vector *W_local;
  N_Vector *X_local;
  int nvec_local;
  
  if ((*X)->ops->nvwrmsnormvectorarray ==
      (_func_int_int_N_Vector_ptr_N_Vector_ptr_realtype_ptr *)0x0) {
    for (local_2c = 0; local_2c < nvec; local_2c = local_2c + 1) {
      rVar1 = (*(*X)->ops->nvwrmsnorm)(X[local_2c],W[local_2c]);
      nrm[local_2c] = rVar1;
    }
    X_local._4_4_ = 0;
  }
  else {
    X_local._4_4_ = (*(*X)->ops->nvwrmsnormvectorarray)(nvec,X,W,nrm);
  }
  return X_local._4_4_;
}

Assistant:

int N_VWrmsNormVectorArray(int nvec, N_Vector* X, N_Vector* W, realtype* nrm)
{
  int i, ier;

  if (X[0]->ops->nvwrmsnormvectorarray != NULL) {
    
    ier = X[0]->ops->nvwrmsnormvectorarray(nvec, X, W, nrm);
    return(ier);

  } else {

    for (i=0; i<nvec; i++) {
      nrm[i] = X[0]->ops->nvwrmsnorm(X[i], W[i]);
    }
    return(0);

  }
}